

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O0

DdNode * Kit_GraphToBdd(DdManager *dd,Kit_Graph_t *pGraph)

{
  Kit_Edge_t KVar1;
  void *pvVar2;
  int iVar3;
  DdNode *pDVar4;
  Kit_Node_t *pKVar5;
  int local_44;
  Kit_Node_t *pKStack_40;
  int i;
  Kit_Node_t *pNode;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdNode *bFunc;
  Kit_Graph_t *pGraph_local;
  DdManager *dd_local;
  
  pKStack_40 = (Kit_Node_t *)0x0;
  iVar3 = Kit_GraphLeaveNum(pGraph);
  if (iVar3 < 0) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                  ,0x67,"DdNode *Kit_GraphToBdd(DdManager *, Kit_Graph_t *)");
  }
  iVar3 = Kit_GraphLeaveNum(pGraph);
  if (pGraph->nSize < iVar3) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) <= pGraph->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                  ,0x68,"DdNode *Kit_GraphToBdd(DdManager *, Kit_Graph_t *)");
  }
  iVar3 = Kit_GraphIsConst(pGraph);
  if (iVar3 == 0) {
    iVar3 = Kit_GraphIsVar(pGraph);
    if (iVar3 == 0) {
      for (local_44 = 0; local_44 < pGraph->nLeaves; local_44 = local_44 + 1) {
        pKStack_40 = Kit_GraphNode(pGraph,local_44);
        pDVar4 = Cudd_bddIthVar(dd,local_44);
        (pKStack_40->field_2).pFunc = pDVar4;
      }
      for (local_44 = pGraph->nLeaves; local_44 < pGraph->nSize; local_44 = local_44 + 1) {
        pKStack_40 = Kit_GraphNode(pGraph,local_44);
        pKVar5 = Kit_GraphNode(pGraph,(uint)pKStack_40->eEdge0 >> 1 & 0x3fffffff);
        pvVar2 = (pKVar5->field_2).pFunc;
        KVar1 = pKStack_40->eEdge0;
        pKVar5 = Kit_GraphNode(pGraph,(uint)pKStack_40->eEdge1 >> 1 & 0x3fffffff);
        pDVar4 = Cudd_bddAnd(dd,(DdNode *)((ulong)pvVar2 ^ (ulong)((uint)KVar1 & 1)),
                             (DdNode *)
                             ((ulong)(pKVar5->field_2).pFunc ^ (ulong)((uint)pKStack_40->eEdge1 & 1)
                             ));
        (pKStack_40->field_2).pFunc = pDVar4;
        Cudd_Ref((DdNode *)(pKStack_40->field_2).pFunc);
      }
      pDVar4 = (DdNode *)(pKStack_40->field_2).pFunc;
      Cudd_Ref(pDVar4);
      for (local_44 = pGraph->nLeaves; local_44 < pGraph->nSize; local_44 = local_44 + 1) {
        pKVar5 = Kit_GraphNode(pGraph,local_44);
        Cudd_RecursiveDeref(dd,(DdNode *)(pKVar5->field_2).pFunc);
      }
      Cudd_Deref(pDVar4);
      iVar3 = Kit_GraphIsComplement(pGraph);
      dd_local = (DdManager *)((ulong)pDVar4 ^ (long)iVar3);
    }
    else {
      iVar3 = Kit_GraphVarInt(pGraph);
      pDVar4 = Cudd_bddIthVar(dd,iVar3);
      iVar3 = Kit_GraphIsComplement(pGraph);
      dd_local = (DdManager *)((ulong)pDVar4 ^ (long)iVar3);
    }
  }
  else {
    pDVar4 = dd->one;
    iVar3 = Kit_GraphIsComplement(pGraph);
    dd_local = (DdManager *)((ulong)pDVar4 ^ (long)iVar3);
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Kit_GraphToBdd( DdManager * dd, Kit_Graph_t * pGraph )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    Kit_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;

    // sanity checks
    assert( Kit_GraphLeaveNum(pGraph) >= 0 );
    assert( Kit_GraphLeaveNum(pGraph) <= pGraph->nSize );

    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Cudd_NotCond( b1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Cudd_NotCond( Cudd_bddIthVar(dd, Kit_GraphVarInt(pGraph)), Kit_GraphIsComplement(pGraph) );

    // assign the elementary variables
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Cudd_bddIthVar( dd, i );

    // compute the function for each internal node
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        bFunc1 = Cudd_NotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( (DdNode *)pNode->pFunc );
    }

    // deref the intermediate results
    bFunc = (DdNode *)pNode->pFunc;   Cudd_Ref( bFunc );
    Kit_GraphForEachNode( pGraph, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pFunc );
    Cudd_Deref( bFunc );

    // complement the result if necessary
    return Cudd_NotCond( bFunc, Kit_GraphIsComplement(pGraph) );
}